

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void sendsuboption(connectdata *conn,int option)

{
  Curl_easy *data;
  void *pvVar1;
  ssize_t sVar2;
  uint *puVar3;
  
  if (option == 0x1f) {
    data = conn->data;
    pvVar1 = (data->req).protop;
    *(undefined2 *)((long)pvVar1 + 0x1cb8) = 0xfaff;
    *(undefined1 *)((long)pvVar1 + 0x1cba) = 0x1f;
    *(char *)((long)pvVar1 + 0x1cbb) = (char)((ushort)*(undefined2 *)((long)pvVar1 + 0x1ca8) >> 8);
    *(char *)((long)pvVar1 + 0x1cbc) = (char)*(undefined2 *)((long)pvVar1 + 0x1ca8);
    *(char *)((long)pvVar1 + 0x1cbd) = (char)((ushort)*(undefined2 *)((long)pvVar1 + 0x1caa) >> 8);
    *(char *)((long)pvVar1 + 0x1cbe) = (char)*(undefined2 *)((long)pvVar1 + 0x1caa);
    *(undefined2 *)((long)pvVar1 + 0x1cbf) = 0xf0ff;
    *(long *)((long)pvVar1 + 0x1ec0) = (long)pvVar1 + 0x1cc1;
    *(void **)((long)pvVar1 + 0x1eb8) = (void *)((long)pvVar1 + 0x1cb8);
    printsub(data,0x3e,(uchar *)((long)pvVar1 + 0x1cba),7);
    sVar2 = send(conn->sock[0],(void *)((long)pvVar1 + 0x1cb8),3,0x4000);
    if (sVar2 < 0) {
      puVar3 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar3);
    }
    send_telnet_data(conn,(char *)((long)pvVar1 + 0x1cbb),4);
    sVar2 = send(conn->sock[0],(void *)((long)pvVar1 + 0x1cbf),2,0x4000);
    if (sVar2 < 0) {
      puVar3 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar3);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;

  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->req.protop;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}